

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ImGuiWindowSettings *pIVar7;
  ulong uVar8;
  
  uVar1 = (ctx->Windows).Size;
  uVar6 = (ulong)uVar1;
  if (uVar1 != 0) {
    uVar8 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar8) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.h"
                      ,0x52a,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar2 = (ctx->Windows).Data[uVar8];
      if ((pIVar2->Flags & 0x100) == 0) {
        uVar1 = pIVar2->SettingsOffset;
        if ((ulong)uVar1 == 0xffffffff) {
          pIVar7 = ImGui::FindWindowSettings(pIVar2->ID);
        }
        else {
          if (((int)uVar1 < 4) || ((ctx->SettingsWindows).Buf.Size <= (int)uVar1)) {
            __assert_fail("off >= 4 && off < Buf.Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_internal.h"
                          ,0x1ae,
                          "T *ImChunkStream<ImGuiWindowSettings>::ptr_from_offset(int) [T = ImGuiWindowSettings]"
                         );
          }
          pIVar7 = (ImGuiWindowSettings *)((ctx->SettingsWindows).Buf.Data + uVar1);
        }
        if (pIVar7 == (ImGuiWindowSettings *)0x0) {
          pIVar7 = ImGui::CreateNewWindowSettings(pIVar2->Name);
          iVar4 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr(&ctx->SettingsWindows,pIVar7);
          pIVar2->SettingsOffset = iVar4;
        }
        if (pIVar7->ID != pIVar2->ID) {
          __assert_fail("settings->ID == window->ID",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                        ,0x2622,
                        "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                       );
        }
        pIVar7->Pos = (ImVec2ih)((int)(pIVar2->Pos).x & 0xffffU | (int)(pIVar2->Pos).y << 0x10);
        pIVar7->Size = (ImVec2ih)
                       ((int)(pIVar2->SizeFull).x & 0xffffU | (int)(pIVar2->SizeFull).y << 0x10);
        pIVar7->Collapsed = pIVar2->Collapsed;
      }
      uVar8 = uVar8 + 1;
      uVar6 = (ulong)(uint)(ctx->Windows).Size;
    } while (uVar8 != uVar6);
  }
  iVar4 = (buf->Buf).Size;
  iVar5 = iVar4 + -1;
  if (iVar4 == 0) {
    iVar5 = 0;
  }
  ImGuiTextBuffer::reserve(buf,iVar5 + (ctx->SettingsWindows).Buf.Size * 6);
  pcVar3 = (ctx->SettingsWindows).Buf.Data;
  if (pcVar3 != (char *)0x0) {
    pIVar7 = (ImGuiWindowSettings *)(pcVar3 + 4);
    do {
      ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pIVar7 + 1);
      ImGuiTextBuffer::appendf
                (buf,"Pos=%d,%d\n",(ulong)(uint)(int)(pIVar7->Pos).x,
                 (ulong)(uint)(int)(pIVar7->Pos).y);
      ImGuiTextBuffer::appendf
                (buf,"Size=%d,%d\n",(ulong)(uint)(int)(pIVar7->Size).x,
                 (ulong)(uint)(int)(pIVar7->Size).y);
      ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)pIVar7->Collapsed);
      ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
      pIVar7 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,pIVar7);
    } while (pIVar7 != (ImGuiWindowSettings *)0x0);
  }
  return;
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->append("\n");
    }
}